

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O2

void lj_asm_trace(jit_State *J,GCtrace *T)

{
  byte *pbVar1;
  char cVar2;
  uint8_t uVar3;
  byte bVar4;
  ushort uVar5;
  ExitNo exitno;
  SnapShot *pSVar6;
  uint64_t uVar7;
  SnapEntry *pSVar8;
  SnapShot *pSVar9;
  Reg down;
  Reg RVar10;
  TraceError e;
  bool bVar11;
  bool bVar12;
  byte bVar13;
  ushort uVar14;
  Reg RVar15;
  GCtrace *pGVar16;
  IRIns *pIVar17;
  ulong uVar18;
  MCode MVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  uint16_t *puVar23;
  MCode *pMVar24;
  int32_t iVar25;
  ulong uVar26;
  uint uVar27;
  IRRef1 IVar28;
  MSize MVar29;
  int iVar30;
  long lVar31;
  MCode MVar32;
  MCode MVar33;
  uint uVar34;
  uint *u64;
  IRIns *pIVar35;
  uint uVar36;
  ASMState local_408;
  TValue local_78;
  uint32_t local_70;
  
  uVar26 = (ulong)(T->nins - 1);
  cVar2 = *(char *)((long)T->ir + uVar26 * 8 + 5);
  if ((cVar2 == '\x14') || (cVar2 == '\f')) {
    while ((cVar2 = *(char *)((long)T->ir + uVar26 * 8 + -3), cVar2 == '\x14' || (cVar2 == '\f'))) {
      uVar26 = uVar26 - 1;
    }
    T->nins = (IRRef)uVar26;
  }
  uVar20 = (J->cur).nins;
  if (J->irtoplim <= uVar20) {
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar20 + 1;
  (J->cur).ir[uVar20] = (IRIns)0xc0000000000;
  local_408.J = J;
  local_408.orignins = uVar20;
  local_408.T = T;
  pGVar16 = lj_trace_alloc(J->L,T);
  J->curfinal = pGVar16;
  local_408.flags = J->flags;
  local_408.loopref = J->loopref;
  local_408.realign = (MCode *)0x0;
  local_408.loopinv = 0;
  if ((ulong)J->parent == 0) {
    local_408.parent = (GCtrace *)0x0;
  }
  else {
    local_408.parent = (GCtrace *)J->trace[J->parent].gcptr64;
  }
  local_408.mcp = lj_mcode_reserve(J,&local_408.mcbot);
  local_408.mctoporig = local_408.mcp;
  local_408.mctop = local_408.mcp;
  local_408.mclim = local_408.mcbot + 0x40;
  uVar14 = (local_408.T)->nsnap;
  if (uVar14 < 0x200) {
    MVar19 = '\x01';
    for (uVar26 = 0; pMVar24 = local_408.mcbot, uVar26 != uVar14 + 0x1f >> 5; uVar26 = uVar26 + 1) {
      if ((local_408.J)->exitstubgroup[uVar26] == (MCode *)0x0) {
        if (local_408.mcp <= local_408.mcbot + 0x8d) goto LAB_0013af14;
        *local_408.mcbot = 'j';
        local_408.mcbot[1] = (MCode)((int)uVar26 << 5);
        MVar32 = 'z';
        MVar33 = MVar19;
        for (lVar31 = 0; (int)lVar31 != 0x7c; lVar31 = lVar31 + 4) {
          local_408.mcbot[lVar31 + 2] = 0xeb;
          local_408.mcbot[lVar31 + 3] = MVar32;
          local_408.mcbot[lVar31 + 4] = 'j';
          local_408.mcbot[lVar31 + 5] = MVar33;
          MVar33 = MVar33 + '\x01';
          MVar32 = MVar32 + 0xfc;
        }
        local_408.mcbot[lVar31 + 2] = 'j';
        local_408.mcbot[lVar31 + 3] = (MCode)(uVar26 >> 3);
        local_408.mcbot[lVar31 + 4] = 0xe9;
        *(int *)(local_408.mcbot + lVar31 + 5) = 0x10c8d6 - (int)local_408.mcbot;
        (local_408.J)->mcbot = local_408.mcbot + lVar31 + 9;
        local_408.mcbot = local_408.mcbot + lVar31 + 9;
        local_408.mclim = pMVar24 + lVar31 + 0x49;
        (local_408.J)->exitstubgroup[uVar26] = pMVar24;
      }
      MVar19 = MVar19 + ' ';
    }
    local_408.mrm.base = '\0';
    pGVar16 = J->curfinal;
LAB_00139bd0:
    local_408.ir = pGVar16->ir;
    (J->cur).nins = local_408.orignins;
    pMVar24 = local_408.mctop;
    if (local_408.realign != (MCode *)0x0) {
      for (uVar20 = (uint)local_408.realign & 0xf; 0 < (int)uVar20; uVar20 = uVar20 - 1) {
        local_408.mctop[-1] = 0x90;
        local_408.mctop = local_408.mctop + -1;
      }
      pMVar24 = local_408.mctop + (ulong)(local_408.loopinv == 0) * 3;
    }
    local_408.invmcp = pMVar24 + -5;
    local_408.mcp = local_408.invmcp;
    if (local_408.loopref == 0) {
      local_408.invmcp = (MCode *)0x0;
      local_408.mcp = pMVar24 + -0xc;
    }
    local_408.mcloop = (MCode *)0x0;
    local_408.flagmcp = (MCode *)0x0;
    local_408.topslot = 0;
    local_408.gcsteps = 0;
    local_408.sectref = local_408.loopref;
    local_408.fuseref = local_408.loopref;
    if ((local_408.flags >> 0x19 & 1) == 0) {
      local_408.fuseref = 0xffffffff;
    }
    uVar3 = (local_408.T)->sinktags;
    local_408.curins = (local_408.T)->nins;
    uVar26 = (ulong)local_408.curins;
    local_408.freeset = 0xffffbfef;
    local_408.modset = 0;
    local_408.weakset = 0;
    local_408.phiset = 0;
    local_408.phireg[0x18] = 0;
    local_408.phireg[0x19] = 0;
    local_408.phireg[0x1a] = 0;
    local_408.phireg[0x1b] = 0;
    local_408.phireg[0x1c] = 0;
    local_408.phireg[0x1d] = 0;
    local_408.phireg[0x1e] = 0;
    local_408.phireg[0x1f] = 0;
    local_408.phireg[0x10] = 0;
    local_408.phireg[0x11] = 0;
    local_408.phireg[0x12] = 0;
    local_408.phireg[0x13] = 0;
    local_408.phireg[0x14] = 0;
    local_408.phireg[0x15] = 0;
    local_408.phireg[0x16] = 0;
    local_408.phireg[0x17] = 0;
    local_408.phireg[8] = 0;
    local_408.phireg[9] = 0;
    local_408.phireg[10] = 0;
    local_408.phireg[0xb] = 0;
    local_408.phireg[0xc] = 0;
    local_408.phireg[0xd] = 0;
    local_408.phireg[0xe] = 0;
    local_408.phireg[0xf] = 0;
    local_408.phireg[0] = 0;
    local_408.phireg[1] = 0;
    local_408.phireg[2] = 0;
    local_408.phireg[3] = 0;
    local_408.phireg[4] = 0;
    local_408.phireg[5] = 0;
    local_408.phireg[6] = 0;
    local_408.phireg[7] = 0;
    for (lVar31 = 0; lVar31 != 0x20; lVar31 = lVar31 + 1) {
      local_408.cost[lVar31] = 0xffff0000;
    }
    for (lVar31 = (ulong)(local_408.T)->nk << 3; lVar31 < 0x40000; lVar31 = lVar31 + 8) {
      *(undefined2 *)((long)local_408.ir + lVar31 + 6) = 0xff;
      if (((0x605fd9U >> (*(uint *)((long)local_408.ir + lVar31 + 4) & 0x1f) & 1) != 0) &&
         (*(char *)((long)local_408.ir + lVar31 + 5) != '\x1b')) {
        *(undefined4 *)((long)local_408.ir + lVar31) = 0;
        lVar31 = lVar31 + 8;
      }
    }
    *(undefined2 *)((long)local_408.ir + 0x40006) = 0x82;
    local_408.snaprename = local_408.curins;
    local_408.snapref = local_408.curins;
    local_408.snapno = (uint)(local_408.T)->nsnap;
    local_408.snapalloc = 0;
    local_408.stopins = 0x8000;
    local_408.orignins = local_408.curins;
    pIVar35 = local_408.ir + 0x8001;
    if (local_408.parent != (GCtrace *)0x0) {
      pIVar17 = lj_snap_regspmap(local_408.J,local_408.parent,(local_408.J)->exitno,pIVar35);
      if (2000 < (long)pIVar17 - (long)pIVar35) {
LAB_0013b0cc:
        e = LJ_TRERR_NYICOAL;
        goto LAB_0013b0d6;
      }
      local_408.stopins = (uint)((ulong)((long)pIVar17 + (-8 - (long)local_408.ir)) >> 3);
      puVar23 = local_408.parentmap;
      for (; pIVar35 < pIVar17; pIVar35 = pIVar35 + 1) {
        uVar14 = (pIVar35->field_0).prev;
        *puVar23 = uVar14;
        puVar23 = puVar23 + 1;
        IVar28 = uVar14 | 0x80;
        if (0xff < uVar14) {
          IVar28 = 0xff;
        }
        (pIVar35->field_0).prev = IVar28;
      }
    }
    local_408.evenspill = 2;
    pIVar17 = local_408.ir + uVar26;
    bVar11 = false;
LAB_00139e39:
    iVar25 = local_408.evenspill;
    if (pIVar17 <= pIVar35) goto LAB_0013a0ce;
    if (uVar3 != '\0') {
      if ((pIVar35->field_1).r != 0xfe) {
        if ((pIVar35->field_1).r != 0xfd) goto LAB_00139e66;
        (pIVar35->field_1).r = 0xfe;
      }
      goto LAB_0013a0c5;
    }
LAB_00139e66:
    switch((pIVar35->field_1).o) {
    case '\x10':
      uVar20 = *(byte *)((long)pIVar35 + -3) - 0x5f;
      if ((4 < uVar20) || (uVar20 == 1)) goto switchD_00139e7d_caseD_42;
      *(undefined2 *)((long)pIVar35 + -2) = 0x80;
      (pIVar35->field_0).prev = 0x82;
      break;
    case '\x11':
switchD_00139e7d_caseD_11:
      bVar11 = true;
      goto switchD_00139e7d_caseD_42;
    default:
      uVar14 = (pIVar35->field_0).op2;
LAB_0013a092:
      if ((((short)uVar14 < 0) || (-1 < (short)(pIVar35->field_0).op1)) ||
         (uVar14 = *(ushort *)((long)local_408.ir + (ulong)(pIVar35->field_0).op1 * 8 + 6),
         0xfc < (uVar14 & 0xff))) goto switchD_00139e7d_caseD_42;
      (pIVar35->field_0).prev = uVar14;
      break;
    case '$':
    case '%':
    case '&':
      if ((local_408.flags & 0x40) == 0) goto switchD_00139e7d_caseD_27;
      goto switchD_00139e7d_caseD_42;
    case '\'':
    case '(':
switchD_00139e7d_caseD_27:
      uVar14 = (pIVar35->field_0).op2;
      if (((short)uVar14 < 0) && (0xfc < *(byte *)((long)local_408.ir + (ulong)uVar14 * 8 + 6))) {
        *(undefined1 *)((long)local_408.ir + (ulong)uVar14 * 8 + 6) = 0x81;
        if (!bVar11) goto LAB_0013a0bc;
        local_408._168_8_ = local_408._168_8_ | 0x200000000;
        goto switchD_00139e7d_caseD_11;
      }
      goto switchD_00139e7d_caseD_42;
    case ',':
    case '-':
switchD_00139e7d_caseD_2c:
      if (((pIVar35->field_1).t.irt & 0x1f) == 0xe) goto switchD_00139e7d_caseD_42;
      (pIVar35->field_0).prev = 0x80;
      if (!bVar11) goto LAB_0013a071;
      local_408._168_8_ = local_408._168_8_ | 0xfc700000000;
LAB_00139e99:
      bVar11 = true;
      break;
    case '.':
      if (((pIVar35->field_1).t.irt & 0x1f) != 0xe) goto switchD_00139e7d_caseD_2c;
LAB_0013a076:
      if (bVar11) {
        local_408._168_8_ = local_408._168_8_ | 0xffff0fc700000000;
      }
      (pIVar35->field_0).prev = 0x90;
      break;
    case '4':
      if (2 < (pIVar35->field_0).op2) goto LAB_0013a076;
      if ((local_408.flags & 0x20) == 0) {
        (pIVar35->field_0).prev = 0x90;
        if (!bVar11) goto LAB_0013a071;
        local_408._168_8_ = local_408._168_8_ | 0xf000100000000;
        goto LAB_00139e99;
      }
      goto switchD_00139e7d_caseD_42;
    case ';':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
    case 'V':
    case 'W':
    case ']':
      (pIVar35->field_0).prev = 0x80;
      if (bVar11) {
        local_408.modset = 0xffff0fc7;
        goto LAB_00139e99;
      }
LAB_0013a071:
      bVar11 = false;
      break;
    case 'B':
    case 'C':
    case 'D':
    case 'F':
    case 'H':
    case '\\':
      goto switchD_00139e7d_caseD_42;
    case 'Y':
    case '^':
      if (bVar11) {
        local_408.modset = 0xffff0fc7;
        goto switchD_00139e7d_caseD_11;
      }
LAB_0013a0bc:
      bVar11 = false;
      goto switchD_00139e7d_caseD_42;
    case '[':
      if ((1 < (byte)(((pIVar35->field_1).t.irt & 0x1f) - 0xd)) &&
         (uVar14 = (pIVar35->field_0).op2, 1 < (ushort)((uVar14 & 0x1f) - 0xd))) goto LAB_0013a092;
switchD_00139e7d_caseD_42:
      (pIVar35->field_0).prev = 0xff;
      break;
    case '_':
    case '`':
    case 'b':
      goto switchD_00139e7d_caseD_5f;
    case 'a':
      if (((pIVar35->field_0).op2 == 0x25) && (local_408.evenspill < 4)) {
        local_408.evenspill = 4;
      }
      goto switchD_00139e7d_caseD_5f;
    case 'c':
      local_70 = asm_callx_flags(&local_408,pIVar35);
      RVar15 = asm_setup_call_slots(&local_408,pIVar35,(CCallInfo *)&local_78.gcr);
      (pIVar35->field_0).prev = (IRRef1)RVar15;
      if (bVar11) {
        local_408._168_8_ = local_408._168_8_ | 0xffff0fc700000000;
      }
    }
    goto LAB_0013a0c5;
  }
  e = LJ_TRERR_SNAPOV;
  goto LAB_0013b0d6;
LAB_0013a0ce:
  local_408.oddspill = 0;
  if ((local_408.evenspill & 1U) != 0) {
    local_408.evenspill = local_408.evenspill + 1;
    local_408.oddspill = iVar25;
  }
  if (local_408.loopref == 0) {
    uVar20 = (local_408.T)->nsnap - 1;
    pSVar6 = (local_408.T)->snap;
    pSVar9 = pSVar6 + uVar20;
    uVar26 = (ulong)pSVar6[uVar20].nent;
    do {
      uVar18 = uVar26;
      if (uVar18 == 0) {
        uVar27 = 0;
        goto LAB_0013a156;
      }
      uVar26 = uVar18 - 1;
    } while (((local_408.T)->snapmap[(ulong)pSVar6[uVar20].mapofs + (uVar18 - 1)] >> 0x10 & 1) == 0)
    ;
    uVar27 = ((local_408.T)->snapmap[(ulong)pSVar6[uVar20].mapofs + (uVar18 - 1)] >> 0x18) - 1;
LAB_0013a156:
    local_408.topslot = (uint)pSVar9->topslot;
    if (local_408.mcp < local_408.mclim) goto LAB_0013af14;
    ra_allocref(&local_408,0x8000,4);
    if ((local_408.T)->link == 0) {
      u64 = (uint *)(*(ulong *)((local_408.T)->snapmap + ((uint)pSVar9->nent + pSVar9->mapofs)) >> 8
                    );
      if (((char)*u64 == 'W') &&
         (uVar7 = (local_408.J)->trace[*u64 >> 0x10].gcptr64,
         0xfffffffb < *(byte *)(uVar7 + 0x50) - 0x4d)) {
        u64 = (uint *)(uVar7 + 0x50);
      }
      emit_loadu64(&local_408,3,(uint64_t)u64);
      iVar25 = ~uVar27 + (uint)pSVar9->nslots;
      uVar34 = *u64;
      uVar21 = (uVar34 & 0xff) - 0x3f;
      uVar21 = uVar21 >> 1 | (uint)((uVar21 & 1) != 0) << 0x1f;
      if (uVar21 - 1 < 2) {
        iVar25 = (iVar25 - ((uVar34 >> 0x10 & 0xff) + (uVar34 >> 8 & 0xff))) + -2;
      }
      else {
        if (uVar21 == 0) {
          uVar21 = uVar34 >> 8 & 0xff;
        }
        else {
          if (uVar21 != 5) {
            if ((uVar34 & 0xff) < 0x59) {
              iVar25 = 0;
            }
            goto LAB_0013a272;
          }
          uVar21 = (uVar34 >> 0x10) + (uVar34 >> 8 & 0xff);
        }
        iVar25 = iVar25 - uVar21;
      }
LAB_0013a272:
      emit_loadi(&local_408,0,iVar25);
    }
    else if (uVar27 != 0) {
      emit_rma(&local_408,XO_MOVto,0x80202,local_408.J[-1].penalty + 0x3c);
    }
    emit_addptr(&local_408,2,uVar27 << 3);
    if ((ulong)(local_408.J)->ktrace != 0) {
      local_408.ir[(ulong)(local_408.J)->ktrace + 1] = (IRIns)(local_408.J)->curfinal;
      *(undefined1 *)((long)local_408.ir + (ulong)(local_408.J)->ktrace * 8 + 5) = 0x18;
    }
    uVar27 = pSVar9->mapofs;
    pSVar8 = (local_408.T)->snapmap;
    bVar13 = pSVar9->nent;
    for (uVar26 = 0; bVar13 != uVar26; uVar26 = uVar26 + 1) {
      uVar21 = pSVar8[uVar27 + uVar26];
      if ((uVar21 >> 0x12 & 1) == 0) {
        iVar22 = (uVar21 >> 0x18) * 8 + -0x10;
        uVar36 = (uVar21 >> 0x18) * 8;
        uVar34 = uVar21 & 0xffff;
        pIVar35 = (IRIns *)((ulong)(uVar34 * 8) + (long)local_408.ir);
        if ((uVar21 >> 0x14 & 1) == 0) {
          if (((pIVar35->field_1).t.irt & 0x1f) == 0xe) {
            RVar15 = ra_alloc1(&local_408,uVar34,0xffff0000);
            emit_rmro(&local_408,XO_MOVSDto,RVar15,2,iVar22);
          }
          else {
            if (0x7fff < uVar34) {
              RVar15 = ra_alloc1(&local_408,uVar34,0xbfeb);
              uVar21 = (pIVar35->field_1).t.irt & 0x1f;
              uVar34 = ~uVar21;
              if ((0x605fd9U >> uVar21 & 1) == 0) {
                emit_movmroi(&local_408,2,uVar36 - 0xc,uVar34 << 0xf | 0x7fff);
              }
              else {
                *(uint *)(local_408.mcp + -4) = uVar34 << 0xf;
                if (uVar36 < 0x8c) {
                  local_408.mcp[-5] = (MCode)(uVar36 - 0xc);
                  local_408.mcp = local_408.mcp + -5;
                  MVar19 = 'J';
                }
                else {
                  *(uint *)(local_408.mcp + -8) = uVar36 - 0xc;
                  local_408.mcp = local_408.mcp + -8;
                  MVar19 = 0x8a;
                }
                local_408.mcp[-1] = MVar19;
                local_408.mcp[-2] = 0x81;
                local_408.mcp = local_408.mcp + -2;
              }
              uVar21._0_2_ = *(IROpT *)((long)pIVar35 + 4);
              uVar21._2_2_ = *(IRRef1 *)((long)pIVar35 + 6);
              RVar15 = -(uint)((0x605fd9U >> (uVar21 & 0x1f) & 1) != 0) & 0x80200 | RVar15;
              goto LAB_0013a57d;
            }
            lj_ir_kvalue((local_408.J)->L,&local_78,pIVar35);
            if (CONCAT44(local_78.field_4.it,local_78.field_4.i) == -1) {
              local_408.mcp[-4] = 0xff;
              local_408.mcp[-3] = 0xff;
              local_408.mcp[-2] = 0xff;
              local_408.mcp[-1] = 0xff;
              if (iVar22 == 0) {
                local_408.mcp = local_408.mcp + -4;
                MVar19 = '\x02';
              }
              else if (uVar21 < 0x12000000) {
                local_408.mcp[-5] = (MCode)iVar22;
                local_408.mcp = local_408.mcp + -5;
                MVar19 = 'B';
              }
              else {
                *(int *)(local_408.mcp + -8) = iVar22;
                local_408.mcp = local_408.mcp + -8;
                MVar19 = 0x82;
              }
              local_408.mcp[-1] = MVar19;
              local_408.mcp[-3] = 'H';
              local_408.mcp[-2] = 199;
              local_408.mcp = local_408.mcp + -3;
            }
            else {
              emit_movmroi(&local_408,2,uVar36 - 0xc,local_78.field_4.it);
              emit_movmroi(&local_408,2,iVar22,local_78.field_4.i);
            }
          }
        }
        else {
          emit_movmroi(&local_408,2,uVar36 - 0xc,-0x18001);
          if (uVar34 < 0x8000) {
            emit_movmroi(&local_408,2,iVar22,pIVar35->i);
          }
          else {
            RVar15 = ra_alloc1(&local_408,uVar34,0xbfeb);
LAB_0013a57d:
            emit_rmro(&local_408,XO_MOVto,RVar15,2,iVar22);
          }
        }
        if (local_408.mcp < local_408.mclim) goto LAB_0013af14;
      }
    }
    if ((uVar18 != 0) && (local_408.parent == (GCtrace *)0x0)) {
      asm_stack_check(&local_408,local_408.topslot,(IRIns *)0x0,local_408.freeset & 0xbfef,uVar20);
    }
  }
  while( true ) {
    local_408.curins = local_408.curins - 1;
    if (local_408.curins <= local_408.stopins) break;
    pIVar35 = local_408.ir + local_408.curins;
    asm_snap_prev(&local_408);
    if ((((-1 < (char)(pIVar35->field_1).r) || ((pIVar35->field_1).s != '\0')) ||
        (0x5f < (((pIVar35->field_1).t.irt | 0x60) & lj_ir_mode[(pIVar35->field_1).o]))) ||
       ((local_408.flags & 0x40000) == 0)) {
      if ((char)(pIVar35->field_1).t.irt < '\0') {
        asm_snap_prep(&local_408);
      }
      if (local_408.mcp < local_408.mclim) goto LAB_0013af14;
      asm_ir(&local_408,pIVar35);
    }
  }
  if ((local_408.realign != (MCode *)0x0) && (pGVar16 = J->curfinal, T->nins <= pGVar16->nins))
  goto LAB_00139bd0;
  if (local_408.mcp < local_408.mclim) {
LAB_0013af14:
    asm_mclimit(&local_408);
  }
  if (0 < local_408.gcsteps) {
    local_408.curins = (IRRef)(local_408.T)->snap->ref;
    asm_snap_prep(&local_408);
    asm_gc_check(&local_408);
    local_408.curins = local_408.stopins;
  }
  for (uVar20 = ~local_408.freeset & 0xffff0000; uVar20 != 0;
      uVar20 = uVar20 & ~(1 << (uVar27 & 0x1f))) {
    uVar27 = 0;
    if (uVar20 != 0) {
      for (; (uVar20 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
      }
    }
    uVar21 = (uint)(ushort)local_408.cost[uVar27];
    if ((uVar21 < 0x8000) && (ra_rematk(&local_408,uVar21), local_408.mcp < local_408.mclim))
    goto LAB_0013af14;
  }
  for (uVar20 = ~local_408.freeset & 0xbfef; uVar20 != 0; uVar20 = uVar20 & ~(1 << (uVar27 & 0x1f)))
  {
    uVar27 = 0;
    if (uVar20 != 0) {
      for (; (uVar20 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
      }
    }
    uVar21 = (uint)(ushort)local_408.cost[uVar27];
    if ((uVar21 < 0x8000) && (ra_rematk(&local_408,uVar21), local_408.mcp < local_408.mclim))
    goto LAB_0013af14;
  }
  if (local_408.parent == (GCtrace *)0x0) {
    bVar13 = *(byte *)((long)local_408.ir + 0x40006);
    if (-1 < (char)bVar13) {
      local_408.freeset = local_408.freeset | 1 << (bVar13 & 0x1f);
      uVar20 = (uint)bVar13;
      if (((local_408.modset >> (uVar20 & 0x1f) & 1) != 0) ||
         ((*(byte *)((long)local_408.ir + 0x40004) & 0x20) != 0)) {
        *(undefined1 *)((long)local_408.ir + 0x40006) = 0xff;
      }
      if (uVar20 != 2) {
        emit_rr(&local_408,XO_MOV,uVar20 | 0x80200,2);
      }
    }
    *(uint *)(local_408.mcp + -4) = (uint)(local_408.T)->traceno;
    local_408.mcp = local_408.mcp + -4;
    emit_rma(&local_408,XO_MOVmi,0,local_408.J[-1].penalty + 0x30);
    uVar20 = local_408.evenspill * 4 + 4U & 0xfffffff0;
    if (local_408.evenspill < 3) {
      uVar20 = 0;
    }
    (local_408.T)->spadjust = (uint16_t)uVar20;
    emit_addptr(&local_408,0x80204,-uVar20);
    (local_408.T)->topslot = *(uint8_t *)(((local_408.T)->startpt).gcptr64 + 0xb);
LAB_0013ae7f:
    for (uVar20 = local_408.phiset; uVar20 != 0; uVar20 = uVar20 & ~(1 << (uVar27 & 0x1f))) {
      uVar21 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
      uVar27 = 0x1f;
      if (uVar21 != 0) {
        for (; uVar21 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      uVar27 = uVar27 ^ 0x18;
      uVar14 = local_408.phireg[uVar27];
      uVar26 = (ulong)uVar14;
      bVar13 = *(byte *)((long)local_408.ir + uVar26 * 8 + 4);
      if (((bVar13 & 0x20) != 0) &&
         (*(byte *)((long)local_408.ir + uVar26 * 8 + 4) = bVar13 & 0xdf,
         *(char *)((long)local_408.ir + uVar26 * 8 + 7) != '\0')) {
        ra_addrename(&local_408,uVar27,(uint)uVar14,local_408.loopsnapno);
      }
    }
    pGVar16 = J->curfinal;
    if (pGVar16->nins < T->nins) {
      lj_trace_free((global_State *)&J[-1].penalty[0x24].val,pGVar16);
      J->curfinal = (GCtrace *)0x0;
      pGVar16 = lj_trace_alloc(J->L,T);
      J->curfinal = pGVar16;
      local_408.realign = (MCode *)0x0;
      goto LAB_00139bd0;
    }
    memcpy(pGVar16->ir + local_408.orignins,T->ir + local_408.orignins,
           (ulong)(T->nins - local_408.orignins) << 3);
    T->nins = J->curfinal->nins;
    local_408.curins = 0x8001;
    asm_snap_prev(&local_408);
    if (local_408.freeset == 0xffffbfef) {
      T->mcode = local_408.mcp;
      MVar29 = 0;
      if (local_408.mcloop != (MCode *)0x0) {
        MVar29 = (int)local_408.mcloop - (int)local_408.mcp;
      }
      T->mcloop = MVar29;
      pMVar24 = local_408.mctop;
      if (local_408.loopref == 0) {
        uVar14 = T->link;
        uVar5 = (local_408.T)->spadjust;
        if (uVar5 == 0) {
          pMVar24 = local_408.mctop + -7;
        }
        else {
          if ((uint)uVar5 == (int)(char)(MCode)uVar5) {
            local_408.mctop[-9] = (MCode)uVar5;
            MVar19 = 0x83;
            pMVar24 = local_408.mctop + -3;
          }
          else {
            *(uint *)(local_408.mctop + -9) = (uint)uVar5;
            MVar19 = 0x81;
          }
          local_408.mctop[-0xc] = 'H';
          local_408.mctop[-0xb] = MVar19;
          local_408.mctop[-10] = 0xc4;
        }
        if ((ulong)uVar14 == 0) {
          iVar22 = 0x10ca4f;
        }
        else {
          iVar22 = (int)*(undefined8 *)((local_408.J)->trace[uVar14].gcptr64 + 0x58);
        }
        *(int *)(pMVar24 + -4) = iVar22 - (int)pMVar24;
        pMVar24[-5] = 0xe9;
        while (local_408.mctop = local_408.mctop + -1, pMVar24 <= local_408.mctop) {
          *local_408.mctop = 0x90;
        }
      }
      local_408.mctop = pMVar24;
      T->szmcode = (int)local_408.mctop - (int)local_408.mcp;
      pSVar9 = (local_408.T)->snap;
      puVar23 = &pSVar9[(local_408.T)->nsnap - 1].mcofs;
      for (uVar20 = (local_408.T)->nsnap - 2; uVar20 != 0xffffffff; uVar20 = uVar20 - 1) {
        *puVar23 = ((short)local_408.mctoporig - (short)local_408.mcp) - pSVar9[uVar20].mcofs;
        puVar23 = puVar23 + -6;
      }
      pSVar9->mcofs = 0;
      lj_mcode_sync(T->mcode,local_408.mctoporig);
      return;
    }
    e = LJ_TRERR_BADRA;
LAB_0013b0d6:
    lj_trace_err(local_408.J,e);
  }
  pIVar35 = (local_408.parent)->ir;
  if ((local_408.snapno != 0) && ((local_408.parent)->topslot < local_408.topslot)) {
    asm_snap_alloc(&local_408,0);
  }
  bVar13 = *(byte *)((long)local_408.ir + 0x40006);
  uVar20 = 0xffffbfef;
  if (-1 < (char)bVar13) {
    uVar21 = (uint)bVar13;
    uVar27 = local_408.freeset | 1 << (uVar21 & 0x1f);
    local_408.freeset = uVar27;
    if (((local_408.modset >> (uVar21 & 0x1f) & 1) != 0) ||
       ((*(byte *)((long)local_408.ir + 0x40004) & 0x20) != 0)) {
      *(undefined1 *)((long)local_408.ir + 0x40006) = 0xff;
    }
    bVar4 = *(byte *)((long)pIVar35 + 0x40006);
    if (bVar4 == bVar13) {
      uVar20 = 1 << (bVar13 & 0x1f) ^ 0xffffbfef;
    }
    else {
      if (-1 < (char)bVar4) {
        if ((uVar27 >> (bVar4 & 0x1f) & 1) != 0) {
          uVar20 = 1 << (bVar4 & 0x1f) ^ 0xffffbfef;
          emit_rr(&local_408,XO_MOV,uVar21 | 0x80200,(uint)bVar4);
          goto LAB_0013a9a8;
        }
      }
      emit_rma(&local_408,XO_MOV,bVar13 | 0x80200,local_408.J[-1].penalty + 0x3c);
    }
  }
LAB_0013a9a8:
  uVar26 = (ulong)local_408.stopins;
  lVar31 = uVar26 * 8;
  bVar12 = false;
  bVar11 = false;
  uVar27 = 0;
  for (; pIVar17 = local_408.ir, 0x8000 < uVar26; uVar26 = uVar26 - 1) {
    uVar14 = local_408.parentmap[(int)uVar26 - 0x8001];
    bVar13 = *(byte *)((long)local_408.ir + lVar31 + 6);
    uVar21 = (uint)bVar13;
    if ((char)bVar13 < '\0') {
      if (*(char *)((long)local_408.ir + lVar31 + 7) != '\0') {
        pbVar1 = (byte *)((long)local_408.ir + lVar31 + 4);
        *pbVar1 = *pbVar1 | 0x20;
        bVar11 = true;
      }
    }
    else {
      uVar20 = uVar20 & ~(1 << (bVar13 & 0x1f));
      if (*(char *)((long)local_408.ir + lVar31 + 7) != '\0') {
        ra_save(&local_408,(IRIns *)((long)local_408.ir + lVar31),(uint)bVar13);
        if (local_408.mcp < local_408.mclim) goto LAB_0013af14;
        bVar13 = *(byte *)((long)pIVar17 + lVar31 + 6);
        uVar21 = (uint)bVar13;
      }
    }
    if (uVar21 == uVar14) {
      local_408.freeset = local_408.freeset | 1 << ((byte)uVar14 & 0x1f);
    }
    else if (uVar14 < 0x100) {
      if ((-1 < (char)bVar13) || (*(char *)((long)pIVar17 + lVar31 + 7) != '\0')) {
        *(short *)((long)&local_78 + (ulong)(uint)uVar14 * 2) = (short)uVar26;
        uVar27 = uVar27 | 1 << (uVar14 & 0x1f);
      }
    }
    else if (-1 < (char)bVar13) {
      bVar12 = true;
    }
    lVar31 = lVar31 + -8;
  }
  uVar21 = local_408.evenspill * 4 + 4U & 0xfffffff0;
  if (local_408.evenspill < 3) {
    uVar21 = 0;
  }
  iVar30 = uVar21 - (local_408.parent)->spadjust;
  iVar22 = iVar30;
  if (iVar30 < 1) {
    iVar22 = 0;
  }
  if (iVar30 < 0) {
    uVar21 = (uint)(local_408.parent)->spadjust;
  }
  (local_408.T)->spadjust = (uint16_t)uVar21;
  if (bVar11) {
    uVar26 = (ulong)local_408.stopins;
    lVar31 = uVar26 * 8;
    for (; 0x8000 < uVar26; uVar26 = uVar26 - 1) {
      bVar13 = *(byte *)((long)local_408.ir + uVar26 * 8 + 4);
      if ((bVar13 & 0x20) != 0) {
        *(byte *)((long)local_408.ir + uVar26 * 8 + 4) = bVar13 & 0xdf;
        uVar14 = local_408.parentmap[(IRRef)uVar26 - 0x8001];
        if (uVar14 < 0x100) {
          *(byte *)((long)local_408.ir + uVar26 * 8 + 6) = (byte)uVar14 | 0x80;
        }
        else if (iVar22 + (uint)(uVar14 >> 8) * 4 ==
                 (uint)*(byte *)((long)local_408.ir + uVar26 * 8 + 7) << 2) goto LAB_0013ac20;
        uVar21 = 0xffff0000;
        if (1 < (byte)((bVar13 & 0x1f) - 0xd)) {
          uVar21 = 0xbfef;
        }
        if ((uVar21 & uVar20) == 0) goto LAB_0013b0cc;
        pIVar17 = (IRIns *)((long)local_408.ir + lVar31);
        RVar15 = ra_allocref(&local_408,(IRRef)uVar26,uVar21 & uVar20);
        ra_save(&local_408,pIVar17,RVar15);
        bVar13 = (byte)RVar15 & 0x1f;
        if (RVar15 == uVar14) {
          local_408.freeset = local_408.freeset | 1 << ((byte)RVar15 & 0x1f);
          uVar27 = uVar27 & (-2 << bVar13 | 0xfffffffeU >> 0x20 - bVar13);
        }
        else if (0xff < uVar14) {
          bVar12 = true;
        }
        if (local_408.mcp < local_408.mclim) goto LAB_0013af14;
        uVar20 = uVar20 & ~(1 << (RVar15 & 0x1f));
      }
LAB_0013ac20:
      lVar31 = lVar31 + -8;
    }
  }
  *(uint *)(local_408.mcp + -4) = (uint)(local_408.T)->traceno;
  local_408.mcp = local_408.mcp + -4;
  emit_rma(&local_408,XO_MOVmi,0,local_408.J[-1].penalty + 0x30);
  emit_addptr(&local_408,0x80204,-iVar22);
  if (bVar12) {
    uVar21 = ~local_408.freeset & 0xffffbfef;
    while (uVar21 != 0) {
      uVar34 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
        }
      }
      uVar14 = (ushort)local_408.cost[uVar34];
      uVar21 = uVar21 & ~(1 << (uVar34 & 0x1f));
      if (0xff < local_408.parentmap[uVar14 - 0x8001]) {
        local_408.freeset = local_408.freeset | 1 << ((byte)uVar34 & 0x1f);
        emit_loadofs(&local_408,local_408.ir + uVar14,uVar34,4,
                     local_408.parentmap[uVar14 - 0x8001] >> 6 & 0xfffffffc);
        if (local_408.mcp < local_408.mclim) goto LAB_0013af14;
      }
    }
  }
  do {
    uVar21 = uVar27 & 0xbfef;
    RVar15 = 0;
    if ((uVar27 & 0xbfef) != 0) {
      for (; (uVar21 >> RVar15 & 1) == 0; RVar15 = RVar15 + 1) {
      }
    }
    uVar34 = uVar27 & 0xffff0000;
    down = 0;
    if ((uVar27 & 0xffff0000) != 0) {
      for (; (uVar34 >> down & 1) == 0; down = down + 1) {
      }
    }
    while( true ) {
      uVar36 = local_408.freeset & uVar27;
      if (uVar36 != 0) break;
      if (uVar27 == 0) {
        bVar13 = (local_408.parent)->topslot;
        (local_408.T)->topslot = bVar13;
        if (bVar13 < local_408.topslot) {
          exitno = (local_408.J)->exitno;
          (local_408.T)->topslot = (uint8_t)local_408.topslot;
          asm_stack_check(&local_408,local_408.topslot,pIVar35 + 0x8000,uVar20 & 0xbfef,exitno);
        }
        goto LAB_0013ae7f;
      }
      if (uVar21 != 0) {
        uVar36 = local_408.freeset & (uVar21 ^ 0xbfef) & uVar20;
        if (uVar36 == 0) goto LAB_0013b0cc;
        RVar10 = 0;
        if (uVar36 != 0) {
          for (; (uVar36 >> RVar10 & 1) == 0; RVar10 = RVar10 + 1) {
          }
        }
        ra_rename(&local_408,RVar15,RVar10);
      }
      if (uVar34 != 0) {
        uVar36 = local_408.freeset & (uVar34 ^ 0xffff0000) & uVar20;
        if (uVar36 == 0) goto LAB_0013b0cc;
        RVar10 = 0;
        if (uVar36 != 0) {
          for (; (uVar36 >> RVar10 & 1) == 0; RVar10 = RVar10 + 1) {
          }
        }
        ra_rename(&local_408,down,RVar10);
      }
      if (local_408.mcp < local_408.mclim) goto LAB_0013af14;
    }
    uVar21 = 0;
    if (uVar36 != 0) {
      for (; (uVar36 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
      }
    }
    pIVar17 = local_408.ir + *(ushort *)((long)&local_78 + (ulong)uVar21 * 2);
    uVar27 = uVar27 & ~(1 << (uVar21 & 0x1f));
    uVar20 = uVar20 & ~(1 << (uVar21 & 0x1f));
    local_408.freeset = local_408.freeset | 1 << ((pIVar17->field_1).r & 0x1f);
    emit_movrr(&local_408,pIVar17,(uint)(pIVar17->field_1).r,uVar21);
  } while (local_408.mclim <= local_408.mcp);
  goto LAB_0013af14;
switchD_00139e7d_caseD_5f:
  uVar14 = (pIVar35->field_0).op2;
  RVar15 = asm_setup_call_slots(&local_408,pIVar35,lj_ir_callinfo + uVar14);
  (pIVar35->field_0).prev = (IRRef1)RVar15;
  if (bVar11) {
    local_408.modset =
         local_408.modset |
         (uint)((*(byte *)((long)&lj_ir_callinfo[uVar14].flags + 1) & 4) >> 2) * 0x10000 - 0xf039;
  }
  else {
    bVar11 = false;
  }
LAB_0013a0c5:
  pIVar35 = pIVar35 + 1;
  goto LAB_00139e39;
}

Assistant:

void lj_asm_trace(jit_State *J, GCtrace *T)
{
  ASMState as_;
  ASMState *as = &as_;

  /* Remove nops/renames left over from ASM restart due to LJ_TRERR_MCODELM. */
  {
    IRRef nins = T->nins;
    IRIns *ir = &T->ir[nins-1];
    if (ir->o == IR_NOP || ir->o == IR_RENAME) {
      do { ir--; nins--; } while (ir->o == IR_NOP || ir->o == IR_RENAME);
      T->nins = nins;
    }
  }

  /* Ensure an initialized instruction beyond the last one for HIOP checks. */
  /* This also allows one RENAME to be added without reallocating curfinal. */
  as->orignins = lj_ir_nextins(J);
  lj_ir_nop(&J->cur.ir[as->orignins]);

  /* Setup initial state. Copy some fields to reduce indirections. */
  as->J = J;
  as->T = T;
  J->curfinal = lj_trace_alloc(J->L, T);  /* This copies the IR, too. */
  as->flags = J->flags;
  as->loopref = J->loopref;
  as->realign = NULL;
  as->loopinv = 0;
  as->parent = J->parent ? traceref(J, J->parent) : NULL;

  /* Reserve MCode memory. */
  as->mctop = as->mctoporig = lj_mcode_reserve(J, &as->mcbot);
  as->mcp = as->mctop;
  as->mclim = as->mcbot + MCLIM_REDZONE;
  asm_setup_target(as);

  /*
  ** This is a loop, because the MCode may have to be (re-)assembled
  ** multiple times:
  **
  ** 1. as->realign is set (and the assembly aborted), if the arch-specific
  **    backend wants the MCode to be aligned differently.
  **
  **    This is currently only the case on x86/x64, where small loops get
  **    an aligned loop body plus a short branch. Not much effort is wasted,
  **    because the abort happens very quickly and only once.
  **
  ** 2. The IR is immovable, since the MCode embeds pointers to various
  **    constants inside the IR. But RENAMEs may need to be added to the IR
  **    during assembly, which might grow and reallocate the IR. We check
  **    at the end if the IR (in J->cur.ir) has actually grown, resize the
  **    copy (in J->curfinal.ir) and try again.
  **
  **    95% of all traces have zero RENAMEs, 3% have one RENAME, 1.5% have
  **    2 RENAMEs and only 0.5% have more than that. That's why we opt to
  **    always have one spare slot in the IR (see above), which means we
  **    have to redo the assembly for only ~2% of all traces.
  **
  **    Very, very rarely, this needs to be done repeatedly, since the
  **    location of constants inside the IR (actually, reachability from
  **    a global pointer) may affect register allocation and thus the
  **    number of RENAMEs.
  */
  for (;;) {
    as->mcp = as->mctop;
#ifdef LUA_USE_ASSERT
    as->mcp_prev = as->mcp;
#endif
    as->ir = J->curfinal->ir;  /* Use the copied IR. */
    as->curins = J->cur.nins = as->orignins;

    RA_DBG_START();
    RA_DBGX((as, "===== STOP ====="));

    /* General trace setup. Emit tail of trace. */
    asm_tail_prep(as);
    as->mcloop = NULL;
    as->flagmcp = NULL;
    as->topslot = 0;
    as->gcsteps = 0;
    as->sectref = as->loopref;
    as->fuseref = (as->flags & JIT_F_OPT_FUSE) ? as->loopref : FUSE_DISABLED;
    asm_setup_regsp(as);
    if (!as->loopref)
      asm_tail_link(as);

    /* Assemble a trace in linear backwards order. */
    for (as->curins--; as->curins > as->stopins; as->curins--) {
      IRIns *ir = IR(as->curins);
      /* 64 bit types handled by SPLIT for 32 bit archs. */
      lj_assertA(!(LJ_32 && irt_isint64(ir->t)),
		 "IR %04d has unsplit 64 bit type",
		 (int)(ir - as->ir) - REF_BIAS);
      asm_snap_prev(as);
      if (!ra_used(ir) && !ir_sideeff(ir) && (as->flags & JIT_F_OPT_DCE))
	continue;  /* Dead-code elimination can be soooo easy. */
      if (irt_isguard(ir->t))
	asm_snap_prep(as);
      RA_DBG_REF();
      checkmclim(as);
      asm_ir(as, ir);
    }

    if (as->realign && J->curfinal->nins >= T->nins)
      continue;  /* Retry in case only the MCode needs to be realigned. */

    /* Emit head of trace. */
    RA_DBG_REF();
    checkmclim(as);
    if (as->gcsteps > 0) {
      as->curins = as->T->snap[0].ref;
      asm_snap_prep(as);  /* The GC check is a guard. */
      asm_gc_check(as);
      as->curins = as->stopins;
    }
    ra_evictk(as);
    if (as->parent)
      asm_head_side(as);
    else
      asm_head_root(as);
    asm_phi_fixup(as);

    if (J->curfinal->nins >= T->nins) {  /* IR didn't grow? */
      lj_assertA(J->curfinal->nk == T->nk, "unexpected IR constant growth");
      memcpy(J->curfinal->ir + as->orignins, T->ir + as->orignins,
	     (T->nins - as->orignins) * sizeof(IRIns));  /* Copy RENAMEs. */
      T->nins = J->curfinal->nins;
      /* Fill mcofs of any unprocessed snapshots. */
      as->curins = REF_FIRST;
      asm_snap_prev(as);
      break;  /* Done. */
    }

    /* Otherwise try again with a bigger IR. */
    lj_trace_free(J2G(J), J->curfinal);
    J->curfinal = NULL;  /* In case lj_trace_alloc() OOMs. */
    J->curfinal = lj_trace_alloc(J->L, T);
    as->realign = NULL;
  }

  RA_DBGX((as, "===== START ===="));
  RA_DBG_FLUSH();
  if (as->freeset != RSET_ALL)
    lj_trace_err(as->J, LJ_TRERR_BADRA);  /* Ouch! Should never happen. */

  /* Set trace entry point before fixing up tail to allow link to self. */
  T->mcode = as->mcp;
  T->mcloop = as->mcloop ? (MSize)((char *)as->mcloop - (char *)as->mcp) : 0;
  if (as->loopref)
    asm_loop_tail_fixup(as);
  else
    asm_tail_fixup(as, T->link);  /* Note: this may change as->mctop! */
  T->szmcode = (MSize)((char *)as->mctop - (char *)as->mcp);
  asm_snap_fixup_mcofs(as);
#if LJ_TARGET_MCODE_FIXUP
  asm_mcode_fixup(T->mcode, T->szmcode);
#endif
  lj_mcode_sync(T->mcode, as->mctoporig);
}